

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O3

GraphicsPipelineBuilder * __thiscall
vkt::geometry::GraphicsPipelineBuilder::addVertexBinding
          (GraphicsPipelineBuilder *this,VkVertexInputBindingDescription vertexBinding)

{
  pointer *ppVVar1;
  iterator __position;
  VkVertexInputBindingDescription local_18;
  
  local_18.inputRate = vertexBinding.inputRate;
  local_18._0_8_ = vertexBinding._0_8_;
  __position._M_current =
       (this->m_vertexInputBindings).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vertexInputBindings).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
    ::_M_realloc_insert<vk::VkVertexInputBindingDescription_const&>
              ((vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
                *)&this->m_vertexInputBindings,__position,&local_18);
  }
  else {
    (__position._M_current)->inputRate = local_18.inputRate;
    (__position._M_current)->binding = local_18.binding;
    (__position._M_current)->stride = local_18.stride;
    ppVVar1 = &(this->m_vertexInputBindings).
               super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return this;
}

Assistant:

GraphicsPipelineBuilder&	addVertexBinding				(const vk::VkVertexInputBindingDescription vertexBinding) { m_vertexInputBindings.push_back(vertexBinding); return *this; }